

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

void Maj_ManFree(Maj_Man_t_conflict *p)

{
  Maj_Man_t_conflict *p_local;
  
  sat_solver_delete(p->pSat);
  Vec_WrdFree(p->vInfo);
  Vec_WecFree(p->vOutLits);
  if (p != (Maj_Man_t_conflict *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Maj_ManFree( Maj_Man_t * p )
{
    bmcg_sat_solver_stop( p->pSat );
    Vec_WrdFree( p->vInfo );
    Vec_WecFree( p->vOutLits );
    ABC_FREE( p );
}